

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O1

TPZGeoMesh * __thiscall
TPZReadTetGen::Process
          (TPZReadTetGen *this,string *NodeFileName,string *FaceFileName,string *TetraFileName)

{
  pointer pcVar1;
  bool bVar2;
  TPZGeoMesh *this_00;
  ostream *poVar3;
  int64_t nvols;
  int64_t nfaces;
  int64_t nnodes;
  allocator_type local_109;
  vector<TPZTimer,_std::allocator<TPZTimer>_> local_108;
  string *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  int64_t local_80;
  int64_t local_78;
  int64_t local_70;
  vector<TPZTimer,_std::allocator<TPZTimer>_> local_68;
  vector<TPZTimer,_std::allocator<TPZTimer>_> local_48;
  
  local_e8 = TetraFileName;
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_00);
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<TPZTimer,_std::allocator<TPZTimer>_>::vector(&local_68,4,&local_109);
  local_48.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_start = local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<TPZTimer,_std::allocator<TPZTimer>_>::~vector(&local_48);
  std::vector<TPZTimer,_std::allocator<TPZTimer>_>::~vector(&local_68);
  std::__cxx11::string::_M_replace
            ((ulong)&(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                      super__Vector_impl_data._M_start)->ProcessName,0,
             (char *)((local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                       super__Vector_impl_data._M_start)->ProcessName)._M_string_length,0x15a4622);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[1].ProcessName,0,
             (char *)local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[1].ProcessName._M_string_length,0x15a4630);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[2].ProcessName,0,
             (char *)local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[2].ProcessName._M_string_length,0x15a463e);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[3].ProcessName,0,
             (char *)local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                     super__Vector_impl_data._M_start[3].ProcessName._M_string_length,0x15a4652);
  TPZTimer::start(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                  super__Vector_impl_data._M_start);
  pcVar1 = (NodeFileName->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + NodeFileName->_M_string_length);
  bVar2 = ProcessNodes(this,&local_a0,this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  TPZTimer::stop(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                 super__Vector_impl_data._M_start);
  if (bVar2) {
    TPZTimer::start(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
    pcVar1 = (FaceFileName->_M_dataplus)._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + FaceFileName->_M_string_length);
    ProcessFaces(this,&local_c0,this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    TPZTimer::stop(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
    TPZTimer::start(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 2);
    pcVar1 = (local_e8->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + local_e8->_M_string_length);
    ProcessTetra(this,&local_e0,this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    TPZTimer::stop(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 2);
    TPZTimer::start(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                    super__Vector_impl_data._M_start + 3);
    TPZGeoMesh::BuildConnectivity(this_00);
    TPZTimer::stop(local_108.super__Vector_base<TPZTimer,_std::allocator<TPZTimer>_>._M_impl.
                   super__Vector_impl_data._M_start + 3);
    poVar3 = ::operator<<((ostream *)&std::cout,(TPZMultiTimer *)&local_108);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    (*(this_00->super_TPZSavable)._vptr_TPZSavable[1])(this_00);
    this_00 = (TPZGeoMesh *)0x0;
  }
  std::vector<TPZTimer,_std::allocator<TPZTimer>_>::~vector(&local_108);
  return this_00;
}

Assistant:

TPZGeoMesh * TPZReadTetGen::Process(std::string NodeFileName, std::string FaceFileName, std::string TetraFileName) {
	TPZGeoMesh * gmesh = new TPZGeoMesh();
	int64_t nnodes;
	int64_t nfaces, nvols;
	bool check;
	
	TPZMultiTimer time(4);
	time.processName(0) = "Reading nodes";
	time.processName(1) = "Reading faces";
	time.processName(2) = "Reading tetrahedras";
	time.processName(3) = "BuildConnectivity";
	
	time.start(0);
	check = this->ProcessNodes(NodeFileName, *gmesh, nnodes);
	time.stop(0);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(1);
	check = this->ProcessFaces(FaceFileName, *gmesh, nfaces);
	time.stop(1);
	if (check == false){
		delete gmesh;
		return NULL;
	}
	
	time.start(2);
	check = this->ProcessTetra(TetraFileName, *gmesh, nvols);
	time.stop(2);
	if (check == false){
		delete gmesh;
		return NULL;
	}
    
	time.start(3);
	gmesh->BuildConnectivity();
	time.stop(3);
	
	std::cout << time << std::endl;
	
	return gmesh;
	
}